

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int SaveEXRMultipartImageToFile
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,char *filename,char **err
              )

{
  size_t __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  size_t written_size;
  size_t mem_size;
  uchar *mem;
  FILE *fp;
  char **in_stack_fffffffffffffee8;
  allocator *paVar1;
  string *in_stack_fffffffffffffef0;
  allocator local_f1;
  string local_f0 [24];
  char **in_stack_ffffffffffffff28;
  uchar **in_stack_ffffffffffffff30;
  size_t sVar2;
  undefined8 in_stack_ffffffffffffff38;
  uint num_parts_00;
  void *__ptr;
  EXRImage *in_stack_ffffffffffffff48;
  string local_b0 [32];
  string local_90 [32];
  FILE *local_70;
  allocator local_51;
  string local_50 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  int local_4;
  
  num_parts_00 = (uint)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  if (((in_RDI == 0) || (in_RSI == 0)) || (in_EDX < 2)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_50,"Invalid argument for SaveEXRMultipartImageToFile",&local_51);
    tinyexr::SetErrorMessage(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    local_4 = -3;
  }
  else {
    local_70 = (FILE *)0x0;
    local_28 = in_RCX;
    local_70 = fopen((char *)in_RCX,"wb");
    if (local_70 == (FILE *)0x0) {
      paVar1 = (allocator *)&stack0xffffffffffffff4f;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b0,(char *)local_28,paVar1);
      std::operator+((char *)paVar1,local_28);
      tinyexr::SetErrorMessage(local_28,in_stack_fffffffffffffee8);
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
      local_4 = -0xb;
    }
    else {
      __ptr = (void *)0x0;
      __n = SaveEXRMultipartImageToMemory
                      (in_stack_ffffffffffffff48,(EXRHeader **)0x0,num_parts_00,
                       in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      if (__n == 0) {
        local_4 = -0xc;
      }
      else {
        sVar2 = 0;
        if ((__n != 0) && (__ptr != (void *)0x0)) {
          sVar2 = fwrite(__ptr,1,__n,local_70);
        }
        free(__ptr);
        fclose(local_70);
        if (sVar2 == __n) {
          local_4 = 0;
        }
        else {
          paVar1 = &local_f1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_f0,"Cannot write a file",paVar1);
          tinyexr::SetErrorMessage(in_stack_fffffffffffffef0,(char **)paVar1);
          std::__cxx11::string::~string(local_f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          local_4 = -0xb;
        }
      }
    }
  }
  return local_4;
}

Assistant:

int SaveEXRMultipartImageToFile(const EXRImage* exr_images,
                                const EXRHeader** exr_headers,
                                unsigned int num_parts,
                                const char* filename,
                                const char** err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts < 2) {
    tinyexr::SetErrorMessage("Invalid argument for SaveEXRMultipartImageToFile",
                              err);
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  FILE *fp = NULL;
#ifdef _WIN32
#if defined(_MSC_VER) || (defined(MINGW_HAS_SECURE_API) && MINGW_HAS_SECURE_API) // MSVC, MinGW GCC, or Clang.
  errno_t errcode =
    _wfopen_s(&fp, tinyexr::UTF8ToWchar(filename).c_str(), L"wb");
  if (errcode != 0) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }
#else
  // Unknown compiler or MinGW without MINGW_HAS_SECURE_API.
  fp = fopen(filename, "wb");
#endif
#else
  fp = fopen(filename, "wb");
#endif
  if (!fp) {
    tinyexr::SetErrorMessage("Cannot write a file: " + std::string(filename),
                             err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  unsigned char *mem = NULL;
  size_t mem_size = SaveEXRMultipartImageToMemory(exr_images, exr_headers, num_parts, &mem, err);
  if (mem_size == 0) {
    return TINYEXR_ERROR_SERIALIZATION_FAILED;
  }

  size_t written_size = 0;
  if ((mem_size > 0) && mem) {
    written_size = fwrite(mem, 1, mem_size, fp);
  }
  free(mem);

  fclose(fp);

  if (written_size != mem_size) {
    tinyexr::SetErrorMessage("Cannot write a file", err);
    return TINYEXR_ERROR_CANT_WRITE_FILE;
  }

  return TINYEXR_SUCCESS;
}